

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveOneofFieldGenerator::GenerateSerializationCode
          (ImmutablePrimitiveOneofFieldGenerator *this,Printer *printer)

{
  JavaType JVar1;
  Printer *printer_local;
  ImmutablePrimitiveOneofFieldGenerator *this_local;
  
  io::Printer::Print(printer,&(this->super_ImmutablePrimitiveFieldGenerator).variables_,
                     "if ($has_oneof_case_message$) {\n  output.write$capitalized_type$(\n");
  JVar1 = GetJavaType((this->super_ImmutablePrimitiveFieldGenerator).descriptor_);
  if (JVar1 == JAVATYPE_BYTES) {
    io::Printer::Print(printer,&(this->super_ImmutablePrimitiveFieldGenerator).variables_,
                       "      $number$, ($type$) $oneof_name$_);\n");
  }
  else {
    io::Printer::Print(printer,&(this->super_ImmutablePrimitiveFieldGenerator).variables_,
                       "      $number$, ($type$)(($boxed_type$) $oneof_name$_));\n");
  }
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void ImmutablePrimitiveOneofFieldGenerator::
GenerateSerializationCode(io::Printer* printer) const {
  printer->Print(variables_,
    "if ($has_oneof_case_message$) {\n"
    "  output.write$capitalized_type$(\n");
  // $type$ and $boxed_type$ is the same for bytes fields so we don't need to
  // do redundant casts.
  if (GetJavaType(descriptor_) == JAVATYPE_BYTES) {
    printer->Print(variables_,
      "      $number$, ($type$) $oneof_name$_);\n");
  } else {
    printer->Print(variables_,
      "      $number$, ($type$)(($boxed_type$) $oneof_name$_));\n");
  }
  printer->Print(
    "}\n");
}